

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_string_ops.hpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
gmlc::utilities::
generalized_section_splitting<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,utilities *this,
          basic_string_view<char,_std::char_traits<char>_> *line,
          basic_string_view<char,_std::char_traits<char>_> *delimiterCharacters,
          basic_string_view<char,_std::char_traits<char>_> *sectionStartCharacters,
          CharMapper<unsigned_char> *sectionMatch,bool compress)

{
  size_type sVar1;
  size_type sVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t sVar4;
  ulong uVar5;
  undefined1 compress_00;
  ulong __pos;
  byte local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> *local_40;
  basic_string_view<char,_std::char_traits<char>_> *local_38;
  
  compress_00 = SUB81(sectionStartCharacters,0);
  local_40 = delimiterCharacters;
  local_38 = sectionStartCharacters;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)this,
                     delimiterCharacters->_M_str,0,delimiterCharacters->_M_len);
  if (sVar1 == 0xffffffffffffffff) {
    generalized_string_split<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              (__return_storage_ptr__,this,line,
               (basic_string_view<char,_std::char_traits<char>_> *)((ulong)sectionMatch & 0xff),
               (bool)compress_00);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)this,line->_M_str,0,
                       line->_M_len);
    if (sVar2 == 0xffffffffffffffff) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)this);
    }
    else {
      uVar5 = *(ulong *)this;
      if (uVar5 != 0) {
        __pos = 0;
        do {
          local_64 = (byte)sectionMatch;
          if (sVar2 < sVar1) {
            paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(sVar2 - __pos);
            if (paVar3 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
              if (local_64 == 0) {
                local_60._M_string_length = 0;
                local_60.field_2._M_local_buf[0] = '\0';
                local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           __return_storage_ptr__,&local_60);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_60._M_dataplus._M_p != &local_60.field_2) {
                  operator_delete(local_60._M_dataplus._M_p,
                                  CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                           local_60.field_2._M_local_buf[0]) + 1);
                }
              }
            }
            else {
              local_60._M_dataplus._M_p = (pointer)(uVar5 - __pos);
              if (paVar3 <= (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(uVar5 - __pos)) {
                local_60._M_dataplus._M_p = (pointer)paVar3;
              }
              local_60._M_string_length = __pos + *(long *)(this + 8);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         __return_storage_ptr__,
                         (basic_string_view<char,_std::char_traits<char>_> *)&local_60);
            }
            __pos = sVar2 + 1;
            sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                              ((basic_string_view<char,_std::char_traits<char>_> *)this,line->_M_str
                               ,__pos,line->_M_len);
          }
          else {
            sVar4 = getChunkEnd<std::basic_string_view<char,std::char_traits<char>>>
                              (sVar1 + 1,(basic_string_view<char,_std::char_traits<char>_> *)this,
                               *(byte *)(*(long *)(this + 8) + sVar1),
                               *(char *)((long)&local_38->_M_len +
                                        (ulong)*(byte *)(*(long *)(this + 8) + sVar1)));
            if (sVar4 == 0xffffffffffffffff) {
              if (*(ulong *)this < __pos) {
                std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > __size (which is %zu)",
                           "basic_string_view::substr",__pos);
              }
              local_60._M_string_length = __pos + *(long *)(this + 8);
              local_60._M_dataplus._M_p = (pointer)(*(ulong *)this - __pos);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         __return_storage_ptr__,
                         (basic_string_view<char,_std::char_traits<char>_> *)&local_60);
              __pos = *(ulong *)this;
            }
            else {
              sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                ((basic_string_view<char,_std::char_traits<char>_> *)this,
                                 line->_M_str,sVar4 + 1,line->_M_len);
              if (sVar1 == 0xffffffffffffffff) {
                if (*(ulong *)this < __pos) {
                  std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > __size (which is %zu)",
                             "basic_string_view::substr",__pos);
                }
                local_60._M_string_length = __pos + *(long *)(this + 8);
                local_60._M_dataplus._M_p = (pointer)(*(ulong *)this - __pos);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           __return_storage_ptr__,
                           (basic_string_view<char,_std::char_traits<char>_> *)&local_60);
                __pos = 0xffffffffffffffff;
                sVar1 = 0xffffffffffffffff;
              }
              else {
                paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(*(ulong *)this - __pos);
                if (*(ulong *)this < __pos) {
                  std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > __size (which is %zu)",
                             "basic_string_view::substr",__pos);
                }
                local_60._M_dataplus._M_p = (pointer)(sVar1 - __pos);
                if (paVar3 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(sVar1 - __pos)) {
                  local_60._M_dataplus._M_p = (pointer)paVar3;
                }
                local_60._M_string_length = __pos + *(long *)(this + 8);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           __return_storage_ptr__,
                           (basic_string_view<char,_std::char_traits<char>_> *)&local_60);
                __pos = sVar1 + 1;
                sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                  ((basic_string_view<char,_std::char_traits<char>_> *)this,
                                   local_40->_M_str,__pos,local_40->_M_len);
              }
              sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                ((basic_string_view<char,_std::char_traits<char>_> *)this,
                                 line->_M_str,__pos,line->_M_len);
            }
          }
          uVar5 = *(ulong *)this;
          if ((__pos != 0xffffffffffffffff) && (sVar2 == 0xffffffffffffffff)) {
            if ((local_64 & uVar5 <= __pos) != 0) {
              return __return_storage_ptr__;
            }
            if (__pos <= uVar5) {
              local_60._M_string_length = __pos + *(long *)(this + 8);
              local_60._M_dataplus._M_p = (pointer)(uVar5 - __pos);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         __return_storage_ptr__,
                         (basic_string_view<char,_std::char_traits<char>_> *)&local_60);
              return __return_storage_ptr__;
            }
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",__pos);
          }
        } while (__pos < uVar5);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<XO> generalized_section_splitting(
    const X& line,
    const X& delimiterCharacters,
    const X& sectionStartCharacters,
    const utilities::CharMapper<unsigned char>& sectionMatch,
    bool compress)
{
    auto sectionLoc = line.find_first_of(sectionStartCharacters);

    if (sectionLoc == X::npos) {
        return generalized_string_split<X, XO>(
            line, delimiterCharacters, compress);
    }
    std::vector<XO> strVec;

    auto d1 = line.find_first_of(delimiterCharacters);
    if (d1 == X::npos)  // there are no delimiters
    {
        strVec.emplace_back(line);
        return strVec;
    }
    decltype(sectionLoc) start = 0;

    while (start < line.length()) {
        if (sectionLoc > d1) {
            if (start == d1) {
                if (!compress) {
                    strVec.push_back(XO{});
                }
            } else {
                strVec.emplace_back(line.substr(start, d1 - start));
            }
            start = d1 + 1;
            d1 = line.find_first_of(delimiterCharacters, start);
        } else {
            // now we are in a quote
            auto endLoc = getChunkEnd(
                sectionLoc + 1,
                line,
                line[sectionLoc],
                sectionMatch[line[sectionLoc]]);
            if (endLoc != X::npos) {
                d1 = line.find_first_of(delimiterCharacters, endLoc + 1);
                if (d1 == X::npos) {
                    strVec.emplace_back(line.substr(start));
                    sectionLoc = d1;
                    start = d1;
                } else {
                    strVec.emplace_back(line.substr(start, d1 - start));
                    sectionLoc =
                        line.find_first_of(sectionStartCharacters, d1 + 1);
                    start = d1 + 1;
                }
                d1 = line.find_first_of(delimiterCharacters, start);
            } else {
                strVec.emplace_back(line.substr(start));
                start = line.length();
            }
        }
        // get the last string
        if (d1 == X::npos) {
            if (start != X::npos) {
                if ((start < line.length()) || (!compress)) {
                    strVec.emplace_back(line.substr(start));
                }
                start = d1;
            }
        }
    }
    return strVec;
}